

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrbdx_binning.cpp
# Opt level: O1

int main(int narg,char **args,char **env)

{
  char *pcVar1;
  char *__s;
  bool bVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  istream *piVar7;
  double *pdVar8;
  void *pvVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  undefined1 *puVar15;
  int n_a;
  int n_b;
  double b_min;
  double delta_b;
  double delta_a;
  double a_max;
  string nomefile;
  double b_max;
  double a_min;
  ifstream infile;
  int local_2c0;
  int local_2bc;
  double local_2b8;
  undefined1 *local_2b0;
  ulong local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  char *local_288;
  char *local_280;
  char local_278 [16];
  ulong local_268;
  double local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  double local_238 [65];
  
  std::ifstream::ifstream(local_238);
  local_288 = local_278;
  local_280 = (char *)0x0;
  local_278[0] = '\0';
  if (narg == 3) {
    std::__cxx11::string::string((string *)local_258,args[1],(allocator *)&local_290);
    iVar4 = std::__cxx11::string::compare((char *)local_258);
    if (local_258[0] != local_248) {
      operator_delete(local_258[0]);
    }
    pcVar1 = local_280;
    if (iVar4 == 0) {
      __s = args[2];
      strlen(__s);
      iVar13 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_288,0,pcVar1,(ulong)__s);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid argument: ",0x12);
      pcVar1 = args[1];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1060e0);
      }
      else {
        sVar5 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
      }
      iVar13 = -2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    }
    if (iVar4 == 0) {
      std::ifstream::open((char *)local_238,(_Ios_Openmode)local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Inizio lettura file ",0x14);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_288,(long)local_280);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      piVar7 = std::istream::_M_extract<double>(local_238);
      piVar7 = std::istream::_M_extract<double>((double *)piVar7);
      pdVar8 = (double *)std::istream::operator>>(piVar7,&local_2c0);
      std::istream::_M_extract<double>(pdVar8);
      piVar7 = std::istream::_M_extract<double>(local_238);
      piVar7 = std::istream::_M_extract<double>((double *)piVar7);
      pdVar8 = (double *)std::istream::operator>>(piVar7,&local_2bc);
      std::istream::_M_extract<double>(pdVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"first bin: min = ",0x11);
      poVar6 = std::ostream::_M_insert<double>((double)local_258[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max = ",8);
      poVar6 = std::ostream::_M_insert<double>(local_290);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", nbin = ",9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", delta = ",10);
      poVar6 = std::ostream::_M_insert<double>(local_298);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"second bin: min = ",0x12);
      poVar6 = std::ostream::_M_insert<double>(local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max = ",8);
      poVar6 = std::ostream::_M_insert<double>(local_260);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", nbin = ",9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2bc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", delta = ",10);
      poVar6 = std::ostream::_M_insert<double>(local_2a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_2b0 = local_258[0];
      lVar12 = ((long)local_2bc + 1) * ((long)local_2c0 + 1);
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)lVar12) {
        uVar11 = lVar12 * 8;
      }
      pvVar9 = operator_new__(uVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"inizializzato vettore lettura a dimensione ",0x2b);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_2bc + local_2c0);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      if (0 < local_2bc) {
        iVar13 = 1;
        do {
          if (0 < local_2c0) {
            iVar4 = 0;
            do {
              std::istream::_M_extract<double>(local_238);
              iVar4 = iVar4 + 1;
            } while (iVar4 < local_2c0);
          }
          bVar2 = iVar13 < local_2bc;
          iVar13 = iVar13 + 1;
        } while (bVar2);
      }
      if (0 < local_2bc) {
        uVar11 = 1;
        local_2a8 = 0;
        puVar15 = local_2b0;
        do {
          local_268 = uVar11;
          if (0 < local_2c0) {
            lVar12 = (long)(int)local_2a8;
            lVar14 = 0;
            do {
              lVar3 = std::cout;
              *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 7;
              *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar3 + -0x18)) =
                   *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar3 + -0x18)) | 0x100;
              local_2b0 = puVar15;
              poVar6 = std::ostream::_M_insert<double>((double)puVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<double>(local_298 + (double)local_2b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<double>(local_2b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<double>(local_2b8 + local_2a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<double>
                                 (*(double *)((long)pvVar9 + (local_2c0 * lVar12 + lVar14) * 8 + 8))
              ;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              puVar15 = (undefined1 *)((double)local_2b0 + local_298);
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 < local_2c0);
          }
          local_2b8 = local_2a0 + local_2b8;
          uVar11 = (ulong)((int)local_268 + 1);
          local_2a8 = (ulong)((int)local_2a8 + 1);
          puVar15 = local_258[0];
        } while ((int)local_268 < local_2bc);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Fine lettura file ",0x12);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_288,(long)local_280);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,". Riscritti ",0xc);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2bc * local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," valori",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ifstream::close();
      iVar13 = 0;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"si usa:  ./reader -f file_ascii_usrbdx.txt",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"si puo\' redirigere l\'output con > out.txt",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    iVar13 = -1;
    std::ostream::flush();
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  std::ifstream::~ifstream(local_238);
  return iVar13;
}

Assistant:

int main (int narg, char *args[], char *env[])
{
	ifstream infile;
	string nomefile;

	if(narg != 3)
	{
		cout << "si usa:  ./reader -f file_ascii_usrbdx.txt" << endl;
		cout << "si puo' redirigere l'output con > out.txt" << endl;
		return -1;
	}

	for (int i = 1; i < narg; i++)	// * We will iterate over args[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in args[0]
		if (string(args[i]) == "-f")
		{
			nomefile = args[i+1];	// We know the next argument *should* be the <nome-file-da-analizzare>:
			i++;					// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else
		{
			cerr << "Invalid argument: " << args[i] << "\n";
			return -2;
		}
	}

	double a_min, a_max, delta_a, a_temp, b_min, b_max, delta_b;
	int n_a, n_b;
	double * values;

	infile.open(nomefile.c_str());
	cerr << "Inizio lettura file " << nomefile << endl;

	infile >> a_min >> a_max >> n_a >> delta_a;
	infile >> b_min >> b_max >> n_b >> delta_b;

	cerr << "first bin: min = " << a_min << ", max = " << a_max << ", nbin = " << n_a << ", delta = " << delta_a << endl;
	cerr << "second bin: min = " << b_min << ", max = " << b_max << ", nbin = " << n_b << ", delta = " << delta_b << endl;

	a_temp = a_min;

	values = new double[(n_a+1)*(n_b+1)];

	cerr << "inizializzato vettore lettura a dimensione " << n_a+n_b << endl;
	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			infile >> values[(i-1)*n_a + j];
		}
	}

	//	for (int i = 1; i <= n_a*n_b; i++) cerr << values[i] << ' ';

	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			cout << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
				<< a_temp+delta_a << "\t" << b_min << "\t" << b_min+delta_b << "\t" << values[(i-1)*n_a + j] << endl;
			a_temp += delta_a;
		}
		a_temp = a_min;
		b_min += delta_b;
	}

	cerr << "Fine lettura file " << nomefile << ". Riscritti " << n_a*n_b << " valori" << endl;
	infile.close();
	return 0;
}